

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

GoniometricLight *
pbrt::GoniometricLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  Allocator alloc_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  ulong uVar4;
  RGBColorSpace *pRVar5;
  GoniometricLight *pGVar6;
  Transform *in_RDX;
  Tuple2<pbrt::Point2,_int> TVar7;
  Image *in_R9;
  Float FVar8;
  double dVar9;
  undefined1 auVar10 [16];
  Transform finalRenderFromLight;
  Transform t;
  Float swapYZ [4] [4];
  Float k_e;
  int u;
  Float sinTheta;
  int v;
  int height;
  int width;
  Float sumY;
  WrapMode2D wrapMode;
  Float phi_v;
  int x;
  int y;
  ImageChannelDesc yDesc;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata imageAndMetadata;
  string texname;
  RGBColorSpace *imageColorSpace;
  Image image;
  Float sc;
  SpectrumHandle I;
  Image *in_stack_fffffffffffff448;
  ImageAndMetadata *in_stack_fffffffffffff450;
  Image *pIVar11;
  WrapMode in_stack_fffffffffffff458;
  undefined4 uVar12;
  WrapMode in_stack_fffffffffffff45c;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff460;
  Float in_stack_fffffffffffff464;
  uint in_stack_fffffffffffff468;
  uint in_stack_fffffffffffff46c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff470;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  char *in_stack_fffffffffffff488;
  Transform *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff490;
  Transform *this;
  undefined4 in_stack_fffffffffffff498;
  undefined4 in_stack_fffffffffffff49c;
  string *in_stack_fffffffffffff4a0;
  ParameterDictionary *in_stack_fffffffffffff4a8;
  SpectrumType in_stack_fffffffffffff4bc;
  Float in_stack_fffffffffffff4c0;
  int in_stack_fffffffffffff4c4;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  Allocator in_stack_fffffffffffff4d0;
  undefined4 in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4dc;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  int iVar14;
  string *local_af8;
  undefined4 in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff530;
  Image *in_stack_fffffffffffff538;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff540;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff548;
  ColorEncodingHandle *in_stack_fffffffffffff560;
  PixelFormat in_stack_fffffffffffff56c;
  Image *in_stack_fffffffffffff570;
  Allocator in_stack_fffffffffffff578;
  undefined6 in_stack_fffffffffffff580;
  Tuple2<pbrt::Point2,_int> desc;
  array<pbrt::WrapMode,_2> wrapMode_00;
  Tuple2<pbrt::Point2,_int> p;
  string *local_a30;
  int local_814;
  int local_80c;
  int iStack_804;
  int local_7fc;
  float local_7f0;
  undefined1 local_7e1 [37];
  float local_7bc;
  Tuple2<pbrt::Point2,_int> local_768;
  int local_760;
  Tuple2<pbrt::Point2,_int> local_75c;
  int local_754;
  Image *local_750;
  undefined1 local_73a;
  allocator<char> local_739;
  string *local_738;
  string local_730 [32];
  string *local_710;
  undefined8 local_708;
  Tuple2<pbrt::Point2,_int> local_6f0;
  undefined1 local_5ca;
  allocator<char> local_5c9;
  WrapMode local_5c8 [2];
  undefined1 local_5c0 [32];
  undefined1 *local_5a0;
  undefined8 local_598;
  undefined1 local_54c;
  allocator<char> local_54b;
  allocator<char> local_54a;
  allocator<char> local_549;
  string *local_548;
  string local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  string *local_4e0;
  undefined8 local_4d8;
  Image *local_488;
  Image local_480;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  RGBColorSpace *local_1d8;
  Image *local_1d0;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  in_stack_fffffffffffffee8;
  polymorphic_allocator<unsigned_char> in_stack_fffffffffffffef0;
  Allocator in_stack_fffffffffffffef8;
  allocator<char> local_a9;
  string local_a8 [36];
  Float local_84;
  Image *local_80;
  allocator<char> local_59;
  string local_58 [56];
  Transform *local_20;
  Image *local_8;
  
  local_20 = in_RDX;
  local_8 = in_R9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((SpectrumHandle *)in_stack_fffffffffffff450,
             (DenselySampledSpectrum *)in_stack_fffffffffffff448);
  local_80 = local_8;
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffff4dc;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffff4d8;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)in_stack_fffffffffffff4d0.memoryResource,
             (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
             in_stack_fffffffffffff4bc,alloc_00);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffff450,
                     (string *)in_stack_fffffffffffff448,0.0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_1d0 = local_8;
  local_84 = FVar8;
  Image::Image((Image *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
               in_stack_fffffffffffff4d0);
  local_1d8 = (RGBColorSpace *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  ResolveFilename((string *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_488 = local_8;
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    Image::Read((string *)in_stack_fffffffffffffef0.memoryResource,in_stack_fffffffffffffef8,
                (ColorEncodingHandle *)in_stack_fffffffffffffee8.bits);
    local_54c = 1;
    local_548 = local_540;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
    local_548 = (string *)local_520;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
    local_548 = (string *)local_500;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
    local_54c = 0;
    local_4e0 = local_540;
    local_4d8 = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff45c;
    v_00._M_array._0_4_ = in_stack_fffffffffffff458;
    v_00._M_len._0_4_ = in_stack_fffffffffffff460;
    v_00._M_len._4_4_ = in_stack_fffffffffffff464;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff450,v_00);
    requestedChannels.n = (size_t)in_stack_fffffffffffff538;
    requestedChannels.ptr = in_stack_fffffffffffff530;
    Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
               requestedChannels);
    local_a30 = (string *)&local_4e0;
    do {
      local_a30 = local_a30 + -0x20;
      std::__cxx11::string::~string(local_a30);
    } while (local_a30 != local_540);
    std::allocator<char>::~allocator(&local_54b);
    std::allocator<char>::~allocator(&local_54a);
    std::allocator<char>::~allocator(&local_549);
    pIVar11 = &local_480;
    local_5ca = 1;
    wrapMode_00.values = (WrapMode  [2])local_5c0;
    p = (Tuple2<pbrt::Point2,_int>)&local_5c9;
    local_5c8 = wrapMode_00.values;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
    local_5ca = 0;
    local_5a0 = local_5c0;
    local_598 = 1;
    v_01._M_array._4_4_ = in_stack_fffffffffffff45c;
    v_01._M_array._0_4_ = in_stack_fffffffffffff458;
    v_01._M_len._0_4_ = in_stack_fffffffffffff460;
    v_01._M_len._4_4_ = in_stack_fffffffffffff464;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff450,v_01);
    requestedChannels_00.n = (size_t)in_stack_fffffffffffff538;
    requestedChannels_00.ptr = in_stack_fffffffffffff530;
    Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
               requestedChannels_00);
    TVar7 = (Tuple2<pbrt::Point2,_int>)&local_5a0;
    do {
      TVar7 = (Tuple2<pbrt::Point2,_int>)((long)TVar7 + -0x20);
      std::__cxx11::string::~string((string *)TVar7);
    } while (TVar7 != (Tuple2<pbrt::Point2,_int>)local_5c0);
    desc = TVar7;
    std::allocator<char>::~allocator(&local_5c9);
    pRVar5 = ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff448);
    local_1d8 = pRVar5;
    uVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6f6d04);
    if ((bool)uVar1) {
      uVar2 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6f6d2a);
      if ((bool)uVar2) {
        ErrorExit<std::__cxx11::string&>
                  ((char *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff478);
      }
      Image::Format(&local_480);
      local_6f0 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_480);
      local_73a = 1;
      local_738 = local_730;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
      local_73a = 0;
      local_710 = local_730;
      local_708 = 1;
      v_02._M_array._4_4_ = in_stack_fffffffffffff45c;
      v_02._M_array._0_4_ = in_stack_fffffffffffff458;
      v_02._M_len._0_4_ = in_stack_fffffffffffff460;
      v_02._M_len._4_4_ = in_stack_fffffffffffff464;
      pstd::
      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffff450,v_02);
      Image::Encoding(in_stack_fffffffffffff448);
      local_750 = local_8;
      channels.ptr._6_1_ = uVar2;
      channels.ptr._0_6_ = in_stack_fffffffffffff580;
      channels.ptr._7_1_ = uVar1;
      channels.n = (size_t)pRVar5;
      Image::Image(in_stack_fffffffffffff570,in_stack_fffffffffffff56c,(Point2i)TVar7,channels,
                   in_stack_fffffffffffff560,in_stack_fffffffffffff578);
      Image::operator=(&in_stack_fffffffffffff450->image,local_8);
      Image::~Image(&in_stack_fffffffffffff450->image);
      local_af8 = (string *)&local_710;
      in_stack_fffffffffffff448 = local_8;
      do {
        local_af8 = local_af8 + -0x20;
        std::__cxx11::string::~string(local_af8);
      } while (local_af8 != local_730);
      std::allocator<char>::~allocator(&local_739);
      local_754 = 0;
      while( true ) {
        iVar14 = local_754;
        local_75c = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)&stack0xfffffffffffffe38);
        if (local_75c.y <= iVar14) break;
        local_760 = 0;
        while( true ) {
          in_stack_fffffffffffff4dc = local_760;
          in_stack_fffffffffffff4e0 =
               (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)&stack0xfffffffffffffe38);
          local_768.x = in_stack_fffffffffffff4e0.x;
          local_768 = in_stack_fffffffffffff4e0;
          if (local_768.x <= in_stack_fffffffffffff4dc) break;
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff450,
                              (int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                              (int)in_stack_fffffffffffff448);
          TVar7 = (Tuple2<pbrt::Point2,_int>)&local_480;
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff450,
                              (int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                              (int)in_stack_fffffffffffff448);
          WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                     in_stack_fffffffffffff45c);
          Image::GetChannels(pIVar11,(Point2i)p,(ImageChannelDesc *)desc,
                             (WrapMode2D)wrapMode_00.values);
          FVar8 = ImageChannelValues::Average
                            ((ImageChannelValues *)
                             CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          Image::SetChannel((Image *)CONCAT44(FVar8,in_stack_fffffffffffff4c8),(Point2i)TVar7,
                            in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0);
          ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x6f7424);
          local_760 = local_760 + 1;
        }
        local_754 = local_754 + 1;
      }
    }
    else {
      bVar3 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6f7577);
      if (!bVar3) {
        ErrorExit<std::__cxx11::string&>
                  ((FileLoc *)in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
      }
      Image::operator=(&in_stack_fffffffffffff450->image,in_stack_fffffffffffff448);
    }
    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x6f75cd);
    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x6f75da);
    ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff450);
  }
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_fffffffffffff450,(SpectrumHandle *)in_stack_fffffffffffff448
            );
  FVar8 = SpectrumToPhotometric
                    ((SpectrumHandle *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460)
                    );
  local_84 = local_84 / FVar8;
  this = (Transform *)local_7e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)local_20,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffff450,
                     (string *)in_stack_fffffffffffff448,0.0);
  std::__cxx11::string::~string((string *)(local_7e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_7e1);
  args = local_20;
  local_7bc = FVar8;
  if (0.0 < FVar8) {
    WrapMode2D::WrapMode2D
              ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
               in_stack_fffffffffffff45c,in_stack_fffffffffffff458);
    local_7f0 = 0.0;
    in_stack_fffffffffffff478 =
         (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)&stack0xfffffffffffffe38);
    local_7fc = in_stack_fffffffffffff478.x;
    in_stack_fffffffffffff470 =
         (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)&stack0xfffffffffffffe38);
    iStack_804 = in_stack_fffffffffffff470.y;
    args = local_20;
    for (local_80c = 0; local_80c < iStack_804; local_80c = local_80c + 1) {
      auVar10._0_4_ = (((float)local_80c + 0.5) * 3.1415927) / (float)iStack_804;
      auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
      dVar9 = std::sin(auVar10._0_8_);
      in_stack_fffffffffffff46c = SUB84(dVar9,0);
      for (local_814 = 0; local_814 < local_7fc; local_814 = local_814 + 1) {
        in_stack_fffffffffffff468 = SUB84(dVar9,0);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff450,
                            (int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                            (int)in_stack_fffffffffffff448);
        Image::GetChannels(in_stack_fffffffffffff538,(Point2i)in_stack_fffffffffffff548,
                           (WrapMode2D)in_stack_fffffffffffff540.values);
        in_stack_fffffffffffff464 =
             ImageChannelValues::Average
                       ((ImageChannelValues *)
                        CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        auVar10 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffff464),
                                  ZEXT416(in_stack_fffffffffffff468),ZEXT416((uint)local_7f0));
        local_7f0 = auVar10._0_4_;
        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x6f78a8);
      }
    }
    local_84 = (local_7bc / ((local_7f0 * 19.73921) / (float)(local_7fc * iStack_804))) * local_84;
  }
  vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  Transform::Transform(this,(Float (*) [4])args);
  Transform::operator*
            ((Transform *)in_stack_fffffffffffff4e0,
             (Transform *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  pIVar11 = (Image *)&local_8;
  pGVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pbrt::RGBColorSpace_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,args,
                      (MediumHandle *)CONCAT44(FVar8,in_stack_fffffffffffff480),
                      (SpectrumHandle *)in_stack_fffffffffffff478,(float *)in_stack_fffffffffffff470
                      ,(Image *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                      (RGBColorSpace **)in_stack_fffffffffffff4a0,
                      (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff4a8);
  uVar12 = SUB84(pGVar6,0);
  uVar13 = (undefined4)((ulong)pGVar6 >> 0x20);
  std::__cxx11::string::~string(local_1f8);
  Image::~Image(pIVar11);
  return (GoniometricLight *)CONCAT44(uVar13,uVar12);
}

Assistant:

GoniometricLight *GoniometricLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc) {
    SpectrumHandle I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;

    std::string texname = ResolveFilename(parameters.GetOneString("filename", ""));
    if (!texname.empty()) {
        ImageAndMetadata imageAndMetadata = Image::Read(texname, alloc);
        ImageChannelDesc rgbDesc = imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
        ImageChannelDesc yDesc = imageAndMetadata.image.GetChannelDesc({"Y"});

        imageColorSpace = imageAndMetadata.metadata.GetColorSpace();

        if (rgbDesc) {
            if (yDesc)
                ErrorExit("%s: has both \"R\", \"G\", and \"B\" or \"Y\" "
                          "channels.",
                          texname);
            image = Image(imageAndMetadata.image.Format(),
                          imageAndMetadata.image.Resolution(), {"Y"},
                          imageAndMetadata.image.Encoding(), alloc);
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    image.SetChannel(
                        {x, y}, 0,
                        imageAndMetadata.image.GetChannels({x, y}, rgbDesc).Average());
        } else if (yDesc)
            image = imageAndMetadata.image;
        else
            ErrorExit(loc,
                      "%s: has neither \"R\", \"G\", and \"B\" or \"Y\" "
                      "channels.",
                      texname);
    }

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        WrapMode2D wrapMode(WrapMode::Repeat, WrapMode::Clamp);
        // integrate over speherical coordinates [0,Pi], [0,2pi]
        Float sumY = 0;
        int width = image.Resolution().x, height = image.Resolution().y;
        for (int v = 0; v < height; ++v) {
            Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
            for (int u = 0; u < width; ++u)
                sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
        }
        Float k_e = 2 * Pi * Pi * sumY / (width * height);
        sc *= phi_v / k_e;
    }

    const Float swapYZ[4][4] = {1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 1};
    Transform t(swapYZ);
    Transform finalRenderFromLight = renderFromLight * t;

    return alloc.new_object<GoniometricLight>(finalRenderFromLight, medium, I, sc,
                                              std::move(image), imageColorSpace, alloc);
}